

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O3

adt_error_t adt_str_push(adt_str_t *self,int c)

{
  int iVar1;
  adt_error_t aVar2;
  
  aVar2 = '\x01';
  if (-1 < c && self != (adt_str_t *)0x0) {
    aVar2 = '\x05';
    if (self->s32Cur < 0x7ffffffe) {
      aVar2 = adt_str_reserve(self,self->s32Cur + 1);
      if (aVar2 == '\0') {
        iVar1 = self->s32Cur;
        if (self->s32Size <= iVar1) {
          __assert_fail("self->s32Cur < self->s32Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                        ,0x1f1,"adt_error_t adt_str_push(adt_str_t *, const int)");
        }
        self->s32Cur = iVar1 + 1;
        self->pAlloc[iVar1] = (uint8_t)c;
        if (self->s32Size <= self->s32Cur) {
          __assert_fail("self->s32Cur < self->s32Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                        ,499,"adt_error_t adt_str_push(adt_str_t *, const int)");
        }
      }
      aVar2 = '\0';
    }
  }
  return aVar2;
}

Assistant:

adt_error_t adt_str_push(adt_str_t *self, const int c)
{
   adt_error_t retval = ADT_NO_ERROR;
   if( (self == 0) || (c < 0) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      if (self->s32Cur > INT_MAX-2)
      {
         retval = ADT_ARRAY_TOO_LARGE_ERROR;
      }
      else
      {
         adt_error_t result = adt_str_reserve(self, self->s32Cur+1);
         if (result == ADT_NO_ERROR)
         {
            assert(self->s32Cur < self->s32Size);
            self->pAlloc[self->s32Cur++] = (uint8_t) c;
            assert(self->s32Cur < self->s32Size);
         }
      }
   }
   return retval;
}